

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O2

void __thiscall optimization::inlineFunc::Rewriter::cast_block(Rewriter *this,BasicBlk *blk)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  Rewriter *this_01;
  bool bVar1;
  int iVar2;
  MirFunction *pMVar3;
  _func_int **pp_Var4;
  Value *pVVar5;
  BasicBlk *pBVar6;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_02;
  uint uVar7;
  mapped_type mVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *__rhs;
  ostream *poVar11;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar12;
  size_type sVar13;
  uint *puVar14;
  VarId *pVVar15;
  _func_int **pp_Var16;
  Value *val;
  Rewriter *pRVar17;
  char *pcVar18;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var19;
  int bb_false;
  mapped_type new_id;
  int pre;
  int bb_true;
  ostream local_3d1;
  Rewriter *local_3d0;
  undefined1 local_3c8 [56];
  size_t sStack_390;
  undefined1 local_388 [31];
  allocator<char> local_369;
  VarId local_368;
  undefined1 local_358;
  undefined1 local_34c [28];
  BasicBlk *local_330;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_328;
  undefined **local_320;
  undefined **local_318;
  undefined **local_310;
  undefined **local_308;
  undefined **local_300;
  undefined **local_2f8;
  undefined **local_2f0;
  undefined **local_2e8;
  _Base_ptr local_2e0;
  undefined **local_2d8;
  uint32_t local_2d0;
  undefined **local_2c8;
  undefined4 local_2c0;
  undefined **local_2b8;
  undefined4 local_2b0;
  undefined **local_2a8;
  uint32_t local_2a0;
  undefined **local_298;
  uint32_t local_290;
  undefined **local_288;
  uint32_t local_280;
  undefined **local_278;
  uint32_t local_270;
  undefined **local_268;
  undefined4 local_260;
  undefined **local_258;
  uint32_t local_250;
  undefined **local_248;
  uint32_t local_240;
  undefined1 local_238 [16];
  undefined **local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  mapped_type local_210;
  int local_20c;
  JumpKind local_208;
  undefined1 local_1a0 [72];
  pointer local_158;
  _Base_ptr p_Stack_150;
  undefined **local_148;
  JumpInstructionKind local_140;
  bool local_128;
  pointer local_120;
  JumpKind local_118;
  Value local_110;
  Value local_f0;
  Value local_d0;
  Value local_b0;
  Value local_90;
  Value local_70;
  Value local_50;
  
  local_328 = &this->label_cast_map;
  pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     (local_328,&blk->id);
  local_34c._0_4_ = *pmVar9;
  pMVar3 = this->func;
  local_1a0._40_8_ = local_1a0 + 0x18;
  local_1a0._0_8_ = &PTR_display_001db458;
  local_1a0._32_8_ = (_Base_ptr)0x0;
  local_1a0._16_8_ = 0;
  local_1a0._24_8_ = 0;
  local_1a0._56_8_ = 0;
  local_1a0._64_8_ = (pointer)0x0;
  local_158 = (pointer)0x0;
  p_Stack_150 = (_Base_ptr)0x0;
  local_34c._4_8_ = &PTR_display_001db418;
  local_148 = &PTR_display_001db418;
  local_140 = Undefined;
  local_128 = false;
  local_120 = (pointer)0xffffffffffffffff;
  local_118 = Undefined;
  local_238._0_4_ = local_34c._0_4_;
  local_1a0._8_4_ = local_34c._0_4_;
  local_1a0._48_8_ = local_1a0._40_8_;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)(local_238 + 8),(BasicBlk *)local_1a0);
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_emplace_unique<std::pair<int,mir::inst::BasicBlk>>
            ((_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
              *)&pMVar3->basic_blks,(pair<int,_mir::inst::BasicBlk> *)local_238);
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)(local_238 + 8));
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)local_1a0);
  pcVar18 = local_34c;
  local_34c._20_8_ =
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::at(&this->func->basic_blks,(key_type *)pcVar18);
  this_00 = &((mapped_type *)local_34c._20_8_)->preceding;
  local_330 = blk;
  for (p_Var10 = (blk->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &(blk->preceding)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    local_238._0_4_ = p_Var10[1]._M_color;
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       (local_328,(key_type *)local_238);
    iVar2 = *pmVar9;
    if (iVar2 == this->sub_starttId) {
      iVar2 = this->cur_blkId;
    }
    local_1a0._0_4_ = iVar2;
    pcVar18 = (char *)local_1a0;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
               (int *)local_1a0);
  }
  p_Var10 = (_Base_ptr)
            (local_330->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2e0 = (_Base_ptr)
              (local_330->inst).
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_3c8._32_8_ = local_34c._20_8_ + 0x40;
  local_34c._12_8_ = &this->var_cast_map;
  local_2e8 = &PTR_display_001daff8;
  local_2f0 = &PTR_display_001db058;
  local_2f8 = &PTR_display_001db178;
  local_300 = &PTR_display_001db1d8;
  local_308 = &PTR_display_001db298;
  local_310 = &PTR_display_001db358;
  local_318 = &PTR_display_001db118;
  local_320 = &PTR_display_001db3b8;
  this_01 = (Rewriter *)(local_3c8 + 0x30);
  local_3d0 = this;
  while( true ) {
    this_02 = local_328;
    pBVar6 = local_330;
    if (p_Var10 == local_2e0) break;
    uVar7 = (**(code **)(*(long *)*(__uniq_ptr_data<mir::inst::Inst,_std::default_delete<mir::inst::Inst>,_true,_true>
                                    *)p_Var10 + 8))();
    pRVar17 = local_3d0;
    if (uVar7 < 8) {
      _Var19._M_head_impl = *(Inst **)p_Var10;
      pcVar18 = (char *)this_01;
      local_3c8._40_8_ = p_Var10;
      switch(uVar7) {
      case 0:
        if (*(undefined ***)_Var19._M_head_impl != local_2e8) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        local_268 = &PTR_display_001d90d0;
        local_260 = *(undefined4 *)((long)_Var19._M_head_impl + 0x10);
        cast_varId((Rewriter *)local_1a0,(VarId *)local_3d0);
        mir::inst::Value::Value(&local_70,(Value *)((long)_Var19._M_head_impl + 0x18));
        cast_value((Value *)local_238,pRVar17,&local_70);
        std::make_unique<mir::inst::AssignInst,mir::inst::VarId,mir::inst::Value>
                  ((VarId *)local_3c8,(Value *)local_1a0);
        local_3c8._48_8_ = local_3c8._0_8_;
        local_3c8._0_8_ = (_func_int **)0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)this_01);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((_Base_ptr)local_3c8._48_8_ != (_Base_ptr)0x0) {
          (**(code **)(*(_func_int **)local_3c8._48_8_ + 0x28))();
        }
        local_3c8._48_8_ = (_Base_ptr)0x0;
        std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
        ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                     *)local_3c8);
        break;
      case 1:
        if (*(undefined ***)_Var19._M_head_impl != local_2f0) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        local_258 = &PTR_display_001d90d0;
        local_250 = ((_Var19._M_head_impl)->dest).id;
        cast_varId(this_01,(VarId *)local_3d0);
        mir::inst::Value::Value(&local_50,(Value *)(_Var19._M_head_impl + 1));
        cast_value((Value *)local_238,pRVar17,&local_50);
        mir::inst::Value::Value(&local_f0,(Value *)&_Var19._M_head_impl[2].dest);
        cast_value((Value *)local_1a0,pRVar17,&local_f0);
        std::
        make_unique<mir::inst::OpInst,mir::inst::VarId,mir::inst::Value,mir::inst::Value,mir::inst::Op&>
                  (&local_368,(Value *)(local_3c8 + 0x30),(Value *)local_238,(Op *)local_1a0);
        local_3c8._0_8_ = local_368.super_Displayable._vptr_Displayable;
        local_368.super_Displayable._vptr_Displayable = (_func_int **)0x0;
        pcVar18 = local_3c8;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)pcVar18);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((undefined **)local_3c8._0_8_ != (undefined **)0x0) {
          (**(code **)(*(undefined **)local_3c8._0_8_ + 0x28))();
        }
        local_3c8._0_8_ = (_func_int **)0x0;
        std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
                   &local_368);
        break;
      case 2:
        if (*(undefined ***)_Var19._M_head_impl != local_2f8) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_238,
                          (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(_Var19._M_head_impl + 1));
        local_1a0._0_8_ = &PTR_display_001d90d0;
        local_1a0._8_4_ = -1;
        local_1a0._32_8_ = local_1a0._32_8_ & 0xffffffffffffff00;
        if (local_220._M_local_buf[8] == _S_red) {
          pvVar12 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_238);
          local_3c8._0_4_ = pvVar12->id;
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   at((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_34c._12_8_,(key_type *)local_3c8);
          local_3c8._48_8_ = &PTR_display_001d90d0;
          sStack_390 = CONCAT44(sStack_390._4_4_,*pmVar9);
          std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                    ((variant<mir::inst::VarId,std::__cxx11::string> *)local_1a0,(VarId *)this_01);
        }
        else {
          __rhs = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_238);
          std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                    ((variant<mir::inst::VarId,std::__cxx11::string> *)local_1a0,__rhs);
        }
        local_248 = &PTR_display_001d90d0;
        local_240 = ((_Var19._M_head_impl)->dest).id;
        cast_varId(this_01,(VarId *)local_3d0);
        std::
        make_unique<mir::inst::RefInst,mir::inst::VarId,std::variant<mir::inst::VarId,std::__cxx11::string>&>
                  (&local_368,
                   (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_01);
        local_3c8._0_8_ = local_368.super_Displayable._vptr_Displayable;
        local_368.super_Displayable._vptr_Displayable = (_func_int **)0x0;
        pcVar18 = local_3c8;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)pcVar18);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((undefined **)local_3c8._0_8_ != (undefined **)0x0) {
          (**(code **)(*(undefined **)local_3c8._0_8_ + 0x28))();
        }
        local_3c8._0_8_ = (_func_int **)0x0;
        std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   &local_368);
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a0);
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_238);
        break;
      case 3:
        if (*(undefined ***)_Var19._M_head_impl != local_300) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        mir::inst::Value::Value(&local_90,(Value *)(_Var19._M_head_impl + 1));
        pRVar17 = local_3d0;
        cast_value((Value *)local_238,local_3d0,&local_90);
        local_278 = &PTR_display_001d90d0;
        local_270 = ((_Var19._M_head_impl)->dest).id;
        cast_varId((Rewriter *)local_1a0,(VarId *)pRVar17);
        std::make_unique<mir::inst::LoadInst,mir::inst::Value,mir::inst::VarId>
                  ((Value *)local_3c8,(VarId *)local_238);
        local_3c8._48_8_ = local_3c8._0_8_;
        local_3c8._0_8_ = (_func_int **)0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)this_01);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((_Base_ptr)local_3c8._48_8_ != (_Base_ptr)0x0) {
          (**(code **)(*(_func_int **)local_3c8._48_8_ + 0x28))();
        }
        local_3c8._48_8_ = (_Base_ptr)0x0;
        std::unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_> *)
                   local_3c8);
        break;
      case 4:
        if (*(undefined ***)_Var19._M_head_impl != local_308) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        mir::inst::Value::Value(&local_b0,(Value *)(_Var19._M_head_impl + 1));
        pRVar17 = local_3d0;
        cast_value((Value *)local_238,local_3d0,&local_b0);
        local_288 = &PTR_display_001d90d0;
        local_280 = ((_Var19._M_head_impl)->dest).id;
        cast_varId((Rewriter *)local_1a0,(VarId *)pRVar17);
        std::make_unique<mir::inst::StoreInst,mir::inst::Value,mir::inst::VarId>
                  ((Value *)local_3c8,(VarId *)local_238);
        local_3c8._48_8_ = local_3c8._0_8_;
        local_3c8._0_8_ = (_func_int **)0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)this_01);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((_Base_ptr)local_3c8._48_8_ != (_Base_ptr)0x0) {
          (**(code **)(*(_func_int **)local_3c8._48_8_ + 0x28))();
        }
        local_3c8._48_8_ = (_Base_ptr)0x0;
        std::unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>::
        ~unique_ptr((unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_> *)
                    local_3c8);
        break;
      case 5:
        if (*(undefined ***)_Var19._M_head_impl != local_310) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        local_2a8 = &PTR_display_001d90d0;
        local_2a0 = ((_Var19._M_head_impl)->dest).id;
        cast_varId((Rewriter *)local_1a0,(VarId *)local_3d0);
        local_2b8 = &PTR_display_001d90d0;
        local_2b0 = *(undefined4 *)&_Var19._M_head_impl[1].dest.super_Displayable._vptr_Displayable;
        cast_varId(this_01,(VarId *)pRVar17);
        mir::inst::Value::Value(&local_d0,(Value *)&_Var19._M_head_impl[1].dest.id);
        cast_value((Value *)local_238,pRVar17,&local_d0);
        std::
        make_unique<mir::inst::PtrOffsetInst,mir::inst::VarId,mir::inst::VarId,mir::inst::Value>
                  (&local_368,(VarId *)local_1a0,(Value *)this_01);
        local_3c8._0_8_ = local_368.super_Displayable._vptr_Displayable;
        local_368.super_Displayable._vptr_Displayable = (_func_int **)0x0;
        pcVar18 = local_3c8;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)pcVar18);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((undefined **)local_3c8._0_8_ != (undefined **)0x0) {
          (**(code **)(*(undefined **)local_3c8._0_8_ + 0x28))();
        }
        local_3c8._0_8_ = (_func_int **)0x0;
        std::unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>::
        ~unique_ptr((unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
                     *)&local_368);
        break;
      case 6:
        if (*(undefined ***)_Var19._M_head_impl != local_318) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        local_388._0_8_ = 0;
        local_3c8._48_8_ = (_Base_ptr)0x0;
        sStack_390 = 0;
        pVVar5 = *(Value **)&_Var19._M_head_impl[2].dest.id;
        for (val = (Value *)_Var19._M_head_impl[2].dest.super_Displayable._vptr_Displayable;
            val != pVVar5; val = val + 1) {
          mir::inst::Value::Value((Value *)local_238,val);
          mir::inst::Value::Value(&local_110,(Value *)local_238);
          cast_value((Value *)local_1a0,local_3d0,&local_110);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
          emplace_back<mir::inst::Value>
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)this_01,
                     (Value *)local_1a0);
        }
        local_298 = &PTR_display_001d90d0;
        local_290 = ((_Var19._M_head_impl)->dest).id;
        cast_varId((Rewriter *)local_238,(VarId *)local_3d0);
        std::
        make_unique<mir::inst::CallInst,mir::inst::VarId,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                  ((VarId *)local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                   (_Var19._M_head_impl + 1));
        local_1a0._0_8_ = local_3c8._0_8_;
        local_3c8._0_8_ = (_func_int **)0x0;
        pcVar18 = (char *)local_1a0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_1a0);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((_func_int **)local_1a0._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_1a0._0_8_ + 0x28))();
        }
        local_1a0._0_8_ = (_func_int **)0x0;
        std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                   local_3c8);
        std::_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~_Vector_base
                  ((_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)this_01);
        break;
      case 7:
        if (*(undefined ***)_Var19._M_head_impl != local_320) {
          _Var19._M_head_impl = (Inst *)0x0;
        }
        local_228 = (_func_int **)0x0;
        local_238._0_8_ = (pointer)0x0;
        local_238._8_8_ = (_func_int **)0x0;
        pp_Var4 = _Var19._M_head_impl[2].super_Displayable._vptr_Displayable;
        for (pp_Var16 = *(_func_int ***)&_Var19._M_head_impl[1].dest.id; pp_Var16 != pp_Var4;
            pp_Var16 = pp_Var16 + 2) {
          local_2c0 = *(undefined4 *)(pp_Var16 + 1);
          local_2c8 = &PTR_display_001d90d0;
          cast_varId((Rewriter *)local_1a0,(VarId *)local_3d0);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
          emplace_back<mir::inst::VarId>
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_238,
                     (VarId *)local_1a0);
        }
        local_2d8 = &PTR_display_001d90d0;
        local_2d0 = ((_Var19._M_head_impl)->dest).id;
        cast_varId((Rewriter *)local_1a0,(VarId *)local_3d0);
        std::
        make_unique<mir::inst::PhiInst,mir::inst::VarId,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>&>
                  ((VarId *)local_3c8,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_1a0);
        local_3c8._48_8_ = local_3c8._0_8_;
        local_3c8._0_8_ = (_func_int **)0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)local_3c8._32_8_,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)this_01);
        p_Var10 = (_Base_ptr)local_3c8._40_8_;
        if ((_Base_ptr)local_3c8._48_8_ != (_Base_ptr)0x0) {
          (**(code **)(*(_func_int **)local_3c8._48_8_ + 0x28))();
        }
        local_3c8._48_8_ = (_Base_ptr)0x0;
        std::unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
                   local_3c8);
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_238);
      }
    }
    else {
      local_3d1 = (ostream)0x0;
      AixLog::operator<<(&local_3d1,(Severity *)pcVar18);
      AixLog::Tag::Tag((Tag *)local_1a0);
      AixLog::operator<<((ostream *)local_1a0,(Tag *)pcVar18);
      local_368._8_8_ = std::chrono::_V2::system_clock::now();
      local_368.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001d8f28;
      local_358 = 0;
      AixLog::operator<<((ostream *)&local_368,(Timestamp *)pcVar18);
      std::__cxx11::string::string<std::allocator<char>>((string *)this_01,"cast_block",&local_369);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                 ,(allocator<char> *)(local_388 + 0x1e));
      pRVar17 = this_01;
      AixLog::Function::Function((Function *)local_238,(string *)this_01,(string *)local_3c8,0xc5);
      AixLog::operator<<((ostream *)local_238,(Function *)pRVar17);
      pcVar18 = "error!";
      poVar11 = std::operator<<((ostream *)&std::clog,"error!");
      std::endl<char,std::char_traits<char>>(poVar11);
      AixLog::Function::~Function((Function *)local_238);
      std::__cxx11::string::~string((string *)local_3c8);
      std::__cxx11::string::~string((string *)this_01);
      AixLog::Tag::~Tag((Tag *)local_1a0);
    }
    p_Var10 = (_Base_ptr)&p_Var10->_M_parent;
  }
  local_3c8._48_4_ = (local_330->jump).bb_false;
  local_1a0._0_4_ = (local_330->jump).bb_true;
  sVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                     (local_328,(key_type *)local_1a0);
  if (sVar13 != 0) {
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       (this_02,(key_type *)local_1a0);
    local_1a0._0_4_ = *pmVar9;
  }
  sVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                     (this_02,(key_type *)(local_3c8 + 0x30));
  if (sVar13 != 0) {
    puVar14 = (uint *)std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                                (this_02,(key_type *)(local_3c8 + 0x30));
    sVar13 = (size_type)*puVar14;
    local_3c8._48_4_ = *puVar14;
  }
  mVar8 = (mapped_type)sVar13;
  bVar1 = (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
          .super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  if (bVar1 != false) {
    pVVar15 = std::optional<mir::inst::VarId>::value(&(pBVar6->jump).cond_or_ret);
    local_238._0_4_ = pVVar15->id;
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_34c._12_8_,(key_type *)local_238);
    mVar8 = *pmVar9;
  }
  local_208 = (pBVar6->jump).jump_kind;
  local_238._0_8_ = local_34c._4_8_;
  local_238._8_4_ = (pBVar6->jump).kind;
  local_220._M_local_buf[8] = bVar1 != false;
  if ((bool)local_220._M_local_buf[8]) {
    local_228 = &PTR_display_001d90d0;
    local_220._M_allocated_capacity._0_4_ = mVar8;
  }
  local_210 = local_1a0._0_4_;
  local_20c = local_3c8._48_4_;
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)(local_34c._20_8_ + 0x58),(JumpInstruction *)local_238);
  return;
}

Assistant:

void cast_block(mir::inst::BasicBlk& blk) {
    auto new_id = label_cast_map.at(blk.id);
    func.basic_blks.insert(std::make_pair(new_id, mir::inst::BasicBlk(new_id)));
    auto& new_blk = func.basic_blks.at(new_id);
    for (auto pre : blk.preceding) {
      auto new_pre = label_cast_map.at(pre);
      if (new_pre == sub_starttId) {
        new_pre = cur_blkId;
      }
      new_blk.preceding.insert(new_pre);
    }

    for (auto& inst : blk.inst) {
      auto kind = inst->inst_kind();
      auto& i = *inst;
      switch (kind) {
        case mir::inst::InstKind::Ref: {
          auto refInst = dynamic_cast<mir::inst::RefInst*>(&i);
          auto val = refInst->val;
          std::variant<mir::inst::VarId, std::string> _val;
          if (val.index() == 0) {
            _val = mir::inst::VarId(
                var_cast_map.at(std::get<mir::inst::VarId>(val).id));
          } else {
            _val = std::get<std::string>(val);
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::RefInst>(
              cast_varId(refInst->dest), _val));
          break;
        }
        case mir::inst::InstKind::Op: {
          auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
              cast_varId(opInst->dest), cast_value(opInst->lhs),
              cast_value(opInst->rhs), opInst->op));
          break;
        }
        case mir::inst::InstKind::Assign: {
          auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::AssignInst>(
              cast_varId(assignInst->dest), cast_value(assignInst->src)));
          break;
        }
        case mir::inst::InstKind::Load: {
          auto loadInst = dynamic_cast<mir::inst::LoadInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::LoadInst>(
              cast_value(loadInst->src), cast_varId(loadInst->dest)));
          break;
        }
        case mir::inst::InstKind::Store: {
          auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::StoreInst>(
              cast_value(storeInst->val), cast_varId(storeInst->dest)));
          break;
        }
        case mir::inst::InstKind::Call: {
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          std::vector<mir::inst::Value> paras;
          for (auto val : callInst->params) {
            paras.push_back(cast_value(val));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::CallInst>(
              cast_varId(callInst->dest), callInst->func, paras));
          break;
        }
        case mir::inst::InstKind::PtrOffset: {
          auto ptrInst = dynamic_cast<mir::inst::PtrOffsetInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::PtrOffsetInst>(
              cast_varId(ptrInst->dest), cast_varId(ptrInst->ptr),
              cast_value(ptrInst->offset)));
          break;
        }
        case mir::inst::InstKind::Phi: {
          auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
          std::vector<mir::inst::VarId> vars;
          for (auto vaR : phiInst->vars) {
            vars.push_back(cast_varId(vaR));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
              cast_varId(phiInst->dest), vars));
          break;
        }

        default:
          LOG(TRACE) << "error!" << std::endl;
      }
    }

    std::optional<mir::inst::VarId> cond_or_ret = {};
    auto bb_true = blk.jump.bb_true;
    auto bb_false = blk.jump.bb_false;
    if (label_cast_map.count(bb_true)) {
      bb_true = label_cast_map.at(bb_true);
      // if (bb_true == sub_endId) {
      //   bb_true = cur_blkId;
      // }
    }

    if (label_cast_map.count(bb_false)) {
      bb_false = label_cast_map.at(bb_false);
      // if (bb_false == sub_endId) {
      //   bb_false = cur_blkId;
      // }
    }

    if (blk.jump.cond_or_ret.has_value()) {
      cond_or_ret = blk.jump.cond_or_ret.value();
      cond_or_ret = mir::inst::VarId(var_cast_map.at(cond_or_ret.value().id));
    }
    new_blk.jump = mir::inst::JumpInstruction(blk.jump.kind, bb_true, bb_false,
                                              cond_or_ret, blk.jump.jump_kind);
  }